

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void CalcTrainSum(char *buf,int start_line,int line_num,
                 vector<int,_std::allocator<int>_> *sum_label0,
                 vector<int,_std::allocator<int>_> *sum_label1,short *cnt_label0,short *cnt_label1)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int *piVar4;
  char cVar5;
  pointer piVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  short *psVar11;
  long lVar12;
  
  pcVar10 = buf + (long)((start_line + line_num) * 0x17a2) + -1;
  do {
    pcVar1 = pcVar10 + 1;
    pcVar10 = pcVar10 + 1;
  } while (*pcVar1 != '\n');
  if (0 < line_num) {
    iVar9 = 0;
    do {
      cVar5 = pcVar10[-1];
      pcVar10 = pcVar10 + -2;
      if (0 < (long)features_num) {
        pvVar7 = sum_label1;
        if (cVar5 == '0') {
          pvVar7 = sum_label0;
        }
        piVar6 = (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar12 = (long)features_num + 1;
        do {
          pcVar1 = pcVar10 + -3;
          iVar8 = *pcVar1 * 100 + -0x12c0;
          pcVar2 = pcVar10 + -7;
          pcVar3 = pcVar10 + -6;
          pcVar10 = pcVar10 + -6;
          if (*pcVar3 == '-') {
            iVar8 = *pcVar1 * -100 + 0x12c0;
            pcVar10 = pcVar2;
          }
          piVar4 = piVar6 + lVar12 + -2;
          *piVar4 = *piVar4 + iVar8;
          lVar12 = lVar12 + -1;
        } while (1 < lVar12);
      }
      iVar9 = iVar9 + 1;
      psVar11 = cnt_label1;
      if (cVar5 == '0') {
        psVar11 = cnt_label0;
      }
      *psVar11 = *psVar11 + 1;
    } while (iVar9 != line_num);
  }
  return;
}

Assistant:

void CalcTrainSum (char * buf, int start_line, int line_num, vector<int> & sum_label0, vector<int> & sum_label1, short & cnt_label0, short & cnt_label1) {

    buf += (start_line + line_num) * 6050; // 假设每行6050个字节，得到该块最后一行的中间某个位置
    while (*buf != '\n') buf++; // 跳到该块最后一个字符就，即该块最后一个换行符的位置


    // 开始倒着读取
    int cnt = 0;
    while (cnt < line_num) {

        buf--; // 跳过换行符，来到该行最后一个label的位置
        int label = *buf - '0';
        buf--; // 来到逗号的位置

        int f_cnt = features_num - 1;
        while (f_cnt >= 0) {

            buf -= 1; // 跳过逗号的位置

            int ret = 100 * (*(buf - 2) - '0');

            buf -= 5; // 跳过浮点数的部分，来到逗号或者符号位的位置。如果是该行第一个数，则会来到上一行的换行符位置
            if (*buf == '-') {ret = -ret;buf--;} // 负数需要取反，并多移动一位

            if (label == 0) {
                sum_label0[f_cnt] += ret;
            } else {
                sum_label1[f_cnt] += ret;
            }
            f_cnt--;

        }

        cnt++;
        if (label == 0) {
            cnt_label0++;
        } else {
            cnt_label1++;
        }
    }
}